

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SetPluginTest.cpp
# Opt level: O3

void __thiscall
TEST_SetPointerPluginTest_doublePointer_Test::~TEST_SetPointerPluginTest_doublePointer_Test
          (TEST_SetPointerPluginTest_doublePointer_Test *this)

{
  Utest::~Utest((Utest *)this);
  operator_delete(this,0x28);
  return;
}

Assistant:

TEST(SetPointerPluginTest, doublePointer)
{
    SetDoublePointerUtestShell *doubletst = new SetDoublePointerUtestShell();
    myRegistry_->addTest(doubletst);
    myRegistry_->runAllTests(*result_);

    CHECK(orig_double_ptr == &orig_double);
    LONGS_EQUAL(1, result_->getCheckCount());
    delete doubletst;
}